

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnAtomicNotifyExpr(Validator *this,AtomicNotifyExpr *expr)

{
  Opcode opcode;
  Result rhs;
  Address alignment;
  AtomicNotifyExpr *expr_local;
  Validator *this_local;
  
  opcode.enum_ = (expr->opcode).enum_;
  alignment = Opcode::GetAlignment(&expr->opcode,expr->align);
  rhs = SharedValidator::OnAtomicNotify
                  (&this->validator_,(Location *)&expr->field_0x18,opcode,alignment);
  Result::operator|=(&this->result_,rhs);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnAtomicNotifyExpr(AtomicNotifyExpr* expr) {
  result_ |= validator_.OnAtomicNotify(expr->loc, expr->opcode,
                                       expr->opcode.GetAlignment(expr->align));
  return Result::Ok;
}